

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internals.h
# Opt level: O0

_Bool excp_is_internal(int excp)

{
  undefined1 local_d;
  int excp_local;
  
  local_d = true;
  if ((((excp != 0x10000) && (local_d = true, excp != 0x10001)) && (local_d = true, excp != 0x10002)
      ) && (((local_d = true, excp != 0x10003 && (local_d = true, excp != 8)) &&
            (local_d = true, excp != 9)))) {
    local_d = excp == 0x10;
  }
  return local_d;
}

Assistant:

static inline bool excp_is_internal(int excp)
{
    /* Return true if this exception number represents a QEMU-internal
     * exception that will not be passed to the guest.
     */
    return excp == EXCP_INTERRUPT
        || excp == EXCP_HLT
        || excp == EXCP_DEBUG
        || excp == EXCP_HALTED
        || excp == EXCP_EXCEPTION_EXIT
        || excp == EXCP_KERNEL_TRAP
        || excp == EXCP_SEMIHOST;
}